

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O1

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::logMessage
          (MockExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  size_t sVar1;
  ArrayDisposer *pAVar2;
  char *pcVar3;
  undefined4 uStack_68;
  LogSeverity severity_local;
  int contextDepth_local;
  int line_local;
  String local_58;
  char *file_local;
  
  severity_local = severity;
  contextDepth_local = contextDepth;
  line_local = line;
  file_local = file;
  ::std::__cxx11::string::append((char *)&this->text);
  str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
            (&local_58,(kj *)&file_local,(char **)0x196501,(char (*) [2])&line_local,(int *)":+",
             (char (*) [3])&contextDepth_local,(int *)0x198619,(char (*) [3])&severity_local,
             (LogSeverity *)0x198619,(char (*) [3])text,(String *)CONCAT44(severity_local,uStack_68)
            );
  pcVar3 = (text->content).ptr;
  if (pcVar3 != (char *)0x0) {
    sVar1 = (text->content).size_;
    pAVar2 = (text->content).disposer;
    (text->content).ptr = (char *)0x0;
    (text->content).size_ = 0;
    (**pAVar2->_vptr_ArrayDisposer)(pAVar2,pcVar3,1,sVar1,sVar1,0);
  }
  (text->content).ptr = local_58.content.ptr;
  (text->content).size_ = local_58.content.size_;
  (text->content).disposer = local_58.content.disposer;
  pcVar3 = (text->content).ptr;
  if ((text->content).size_ == 0) {
    pcVar3 = (char *)0x0;
  }
  ::std::__cxx11::string::replace
            ((ulong)&this->text,(this->text)._M_string_length,(char *)0x0,(ulong)pcVar3);
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    this->text += "log message: ";
    text = str(file, ":", line, ":+", contextDepth, ": ", severity, ": ", mv(text));
    this->text.append(text.begin(), text.end());
  }